

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlinePolymorphicFunction
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,bool *pIsInlined,uint recursiveInlineDepth,bool triedUsingFixedMethods
          )

{
  Instr *instrNext;
  ScriptContext *scriptContext;
  bool bVar1;
  ArgSlot AVar2;
  uint uVar3;
  RegOpnd *pRVar4;
  StackSym *pSVar5;
  SymOpnd *pSVar6;
  PropertySymOpnd *pPVar7;
  FunctionJITTimeInfo *pFVar8;
  JITTimeFunctionBody *pJVar9;
  char16 *pcVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  FunctionJITTimeInfo *pFVar14;
  Opnd *pOVar15;
  LabelInstr *doneLabel;
  LabelInstr *instr;
  LabelInstr *pLVar16;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  IndirOpnd *src1Opnd;
  intptr_t address;
  AddrOpnd *src2Opnd;
  BranchInstr *instr_00;
  Inline *pIVar17;
  ThreadContext *this_00;
  uint i;
  ulong uVar18;
  Instr *pIVar19;
  wchar local_158 [4];
  char16 debugStringBuffer [42];
  wchar local_f8 [4];
  char16 debugStringBuffer2 [42];
  FunctionJITTimeInfo *pFStack_98;
  FunctionJITTimeInfo *inlineesDataArray [4];
  RegOpnd *local_48;
  
  instrNext = callInstr->m_next;
  *pIsInlined = false;
  inlineesDataArray[3] = (FunctionJITTimeInfo *)symCallerThis;
  if (triedUsingFixedMethods) {
    pRVar4 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
    pSVar5 = Sym::AsStackSym(&pRVar4->m_sym->super_Sym);
    if (((pSVar5->field_0x18 & 1) != 0) && ((pSVar5->field_5).m_instrDef != (Instr *)0x0)) {
      pRVar4 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
      pSVar5 = Sym::AsStackSym(&pRVar4->m_sym->super_Sym);
      if ((pSVar5->field_0x18 & 1) == 0) {
        pIVar19 = (Instr *)0x0;
      }
      else {
        pIVar19 = (pSVar5->field_5).m_instrDef;
      }
      bVar1 = IR::Opnd::IsSymOpnd(pIVar19->m_src1);
      if (bVar1) {
        pSVar6 = IR::Opnd::AsSymOpnd(pIVar19->m_src1);
        bVar1 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
        if (bVar1) {
          pIVar17 = (Inline *)pIVar19->m_src1;
          pPVar7 = IR::Opnd::AsPropertySymOpnd((Opnd *)pIVar17);
          TryResetObjTypeSpecFldInfoOn(pIVar17,pPVar7);
          pIVar17 = (Inline *)pIVar19->m_src1;
          pPVar7 = IR::Opnd::AsPropertySymOpnd((Opnd *)pIVar17);
          TryDisableRuntimePolymorphicCacheOn(pIVar17,pPVar7);
        }
      }
    }
  }
  pSVar5 = (StackSym *)inlinerData;
  pFVar8 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  if (!triedUsingFixedMethods) {
    pFVar14 = FunctionJITTimeInfo::GetNext(pFVar8);
    if (pFVar14 == (FunctionJITTimeInfo *)0x0) {
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
      if (!bVar1) {
        return instrNext;
      }
      pJVar9 = FunctionJITTimeInfo::GetBody(pFVar8);
      pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_158);
      pJVar9 = FunctionJITTimeInfo::GetBody(inlinerData);
      pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar9);
      pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
      Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                    ,pcVar10,pcVar11,pcVar12,pcVar13);
      goto LAB_004ffa6c;
    }
    pSVar5 = (StackSym *)callInstr->m_src2;
    if ((pSVar5 != (StackSym *)0x0) && (bVar1 = IR::Opnd::IsSymOpnd((Opnd *)pSVar5), bVar1)) {
      pSVar6 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
      pSVar5 = Sym::AsStackSym(pSVar6->m_sym);
      AVar2 = StackSym::GetArgSlotNum(pSVar5);
      if (0xf < AVar2) {
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
        if (!bVar1) {
          return instrNext;
        }
        pJVar9 = FunctionJITTimeInfo::GetBody(pFVar8);
        pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar9);
        pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_158);
        pSVar6 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
        pSVar5 = Sym::AsStackSym(pSVar6->m_sym);
        AVar2 = StackSym::GetArgSlotNum(pSVar5);
        pJVar9 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar9);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
        Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                      ,pcVar10,pcVar11,(ulong)AVar2,0xf,pcVar12,pcVar13);
        goto LAB_004ffa6c;
      }
    }
  }
  inlineesDataArray[1] = (FunctionJITTimeInfo *)0x0;
  inlineesDataArray[2] = (FunctionJITTimeInfo *)0x0;
  pFStack_98 = (FunctionJITTimeInfo *)0x0;
  inlineesDataArray[0] = (FunctionJITTimeInfo *)0x0;
  uVar3 = FillInlineesDataArray((Inline *)pSVar5,pFVar8,&pFStack_98,4);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
  if (0xfffffffc < uVar3 - 5) {
    if (bVar1) {
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
      pFVar8 = inlineesDataArray[uVar18 - 1];
      pJVar9 = FunctionJITTimeInfo::GetBody(pFVar8);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
      if (bVar1) {
        pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar9);
        pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_158);
        pJVar9 = FunctionJITTimeInfo::GetBody(inlinerData);
        pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar9);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
        Output::Print(L"INLINING (Polymorphic): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                      ,pcVar10,pcVar11,pcVar12,pcVar13);
        Output::Flush();
      }
    }
    this_00 = (ThreadContext *)&DAT_014594b0;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
    if (bVar1) {
      this_00 = (ThreadContext *)0xe45252;
      Output::Print(L"------------------------------------------------\n");
      Output::Flush();
    }
    *pIsInlined = true;
    if (this->topFunc->m_isBackgroundJIT == false) {
      scriptContext = (ScriptContext *)this->topFunc->m_scriptContextInfo;
      this_00 = scriptContext->threadContext;
      ThreadContext::ProbeStackNoDispose(this_00,0xc00,scriptContext,(PVOID)0x0);
    }
    if (callInstr->m_dst == (Opnd *)0x0) {
      local_48 = (RegOpnd *)0x0;
    }
    else {
      pOVar15 = IR::Instr::UnlinkDst(callInstr);
      local_48 = IR::Opnd::AsRegOpnd(pOVar15);
      this_00 = (ThreadContext *)local_48->m_sym;
      StackSym::GetByteCodeRegSlot((StackSym *)this_00);
    }
    InsertJsFunctionCheck((Inline *)this_00,callInstr,callInstr,BailOutOnPolymorphicInlineFunction);
    IR::Instr::MoveArgs(callInstr,true);
    doneLabel = IR::LabelInstr::New(Label,callInstr->m_func,false);
    instr = IR::LabelInstr::New(Label,callInstr->m_func,false);
    pLVar16 = (LabelInstr *)callInstr;
    IR::Instr::InsertBefore(callInstr,&instr->super_Instr);
    for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
      pLVar16 = IR::LabelInstr::New(Label,callInstr->m_func,false);
      IR::Instr::InsertBefore(callInstr,&pLVar16->super_Instr);
      pOVar15 = callInstr->m_src1;
      pFVar8 = inlineesDataArray[uVar18 - 1];
      inlineeRuntimeData = FunctionJITTimeInfo::GetRuntimeInfo(pFVar8);
      InsertOneInlinee(this,callInstr,local_48,pOVar15,pFVar8,inlineeRuntimeData,doneLabel,
                       (StackSym *)inlineesDataArray[3],false,recursiveInlineDepth);
      pRVar4 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
      src1Opnd = IR::IndirOpnd::New(pRVar4,0x28,TyUint64,(instr->super_Instr).m_func,false);
      address = FunctionJITTimeInfo::GetFunctionInfoAddr(pFVar8);
      src2Opnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicFunctionInfo,
                                   (instr->super_Instr).m_func,false,(Var)0x0);
      instr_00 = IR::BranchInstr::New
                           (BrAddr_A,pLVar16,&src1Opnd->super_Opnd,&src2Opnd->super_Opnd,
                            (instr->super_Instr).m_func);
      pLVar16 = instr;
      IR::Instr::InsertBefore(&instr->super_Instr,&instr_00->super_Instr);
    }
    CompletePolymorphicInlining
              ((Inline *)pLVar16,callInstr,local_48,doneLabel,&instr->super_Instr,(Instr *)0x0,
               BailOutOnPolymorphicInlineFunction);
    Func::SetHasInlinee(this->topFunc);
    InsertStatementBoundary(this,instrNext);
    return instrNext;
  }
  if (!bVar1) {
    return instrNext;
  }
  pJVar9 = FunctionJITTimeInfo::GetBody(pFVar8);
  pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar9);
  pcVar11 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_158);
  pJVar9 = FunctionJITTimeInfo::GetBody(inlinerData);
  pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar9);
  pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])local_f8);
  Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                ,(ulong)uVar3,4,pcVar10,pcVar11,pcVar12,pcVar13);
LAB_004ffa6c:
  Output::Flush();
  return instrNext;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunction(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, bool* pIsInlined, uint recursiveInlineDepth, bool triedUsingFixedMethods)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;


    if (triedUsingFixedMethods)
    {
        if (callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->IsSingleDef())
        {
            IR::Instr* ldMethodFldInstr = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
            if (ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
            {
                TryResetObjTypeSpecFldInfoOn(ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd());
                TryDisableRuntimePolymorphicCacheOn(ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd());
            }
        }
    }

    const FunctionJITTimeInfo * inlineeJitTimeData = inlinerData->GetInlinee(profileId);
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (!triedUsingFixedMethods) // We would have done the following two checks when we tried to inline using fixed methods
    {
        if(!inlineeJitTimeData->GetNext())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                     inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

            //There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
            return instrNext;
        }

        if (callInstr->GetSrc2() &&
            callInstr->GetSrc2()->IsSymOpnd() &&
            callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
            // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
            // data matching does not take into account some types of changes to source code. Need to check this again with current
            // information.
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
                inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
                Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

            return instrNext;
        }
    }

    const FunctionJITTimeInfo * inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    uint inlineeCount = FillInlineesDataArray(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        return instrNext;
    }

    // Begin inlining.
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < inlineeCount; i++)
    {
        __analysis_assert(inlineesDataArray[i] != nullptr);
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    *pIsInlined = true;

    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    Assert(inlineeCount >= 2);

    // Shared bailout point for all the guard check bailouts.
    InsertJsFunctionCheck(callInstr, callInstr, IR::BailOutOnPolymorphicInlineFunction);

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for (uint i = 0; i < inlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);
        InsertOneInlinee(callInstr, returnValueOpnd, callInstr->GetSrc1(), inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, /*fixedFunctionSafeThis*/ false, recursiveInlineDepth);

        IR::RegOpnd* functionObject = callInstr->GetSrc1()->AsRegOpnd();
        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            IR::IndirOpnd::New(functionObject, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, dispatchStartLabel->m_func),
            IR::AddrOpnd::New(inlineesDataArray[i]->GetFunctionInfoAddr(), IR::AddrOpndKindDynamicFunctionInfo, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
    }

    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, /*ldMethodFldInstr*/nullptr, IR::BailOutOnPolymorphicInlineFunction);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);

    return instrNext;

}